

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.c
# Opt level: O0

void ge_add(ge_p1p1 *r,ge_p3 *p,ge_cached *q)

{
  int32_t *in_RSI;
  int32_t *in_RDI;
  fe t0;
  int32_t *in_stack_00000378;
  int32_t *in_stack_00000380;
  int32_t *in_stack_00000388;
  int32_t aiStack_48 [14];
  int32_t *local_10;
  int32_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  fe_add(in_RDI,in_RSI + 10,in_RSI);
  fe_sub(local_8 + 10,local_10 + 10,local_10);
  fe_mul(in_stack_00000388,in_stack_00000380,in_stack_00000378);
  fe_mul(in_stack_00000388,in_stack_00000380,in_stack_00000378);
  fe_mul(in_stack_00000388,in_stack_00000380,in_stack_00000378);
  fe_mul(in_stack_00000388,in_stack_00000380,in_stack_00000378);
  fe_add(aiStack_48,local_8,local_8);
  fe_sub(local_8,local_8 + 0x14,local_8 + 10);
  fe_add(local_8 + 10,local_8 + 0x14,local_8 + 10);
  fe_add(local_8 + 0x14,aiStack_48,local_8 + 0x1e);
  fe_sub(local_8 + 0x1e,aiStack_48,local_8 + 0x1e);
  return;
}

Assistant:

static void ge_add(ge_p1p1 *r, const ge_p3 *p, const ge_cached *q)
{
    fe t0;

    fe_add(r->X, p->Y, p->X);
    fe_sub(r->Y, p->Y, p->X);
    fe_mul(r->Z, r->X, q->YplusX);
    fe_mul(r->Y, r->Y, q->YminusX);
    fe_mul(r->T, q->T2d, p->T);
    fe_mul(r->X, p->Z, q->Z);
    fe_add(t0, r->X, r->X);
    fe_sub(r->X, r->Z, r->Y);
    fe_add(r->Y, r->Z, r->Y);
    fe_add(r->Z, t0, r->T);
    fe_sub(r->T, t0, r->T);
}